

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vgetmantss(PDISASM pMyDisasm)

{
  char *pcVar1;
  Int32 IVar2;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01')) {
    ArgsVEX(pMyDisasm);
    getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
      builtin_strncpy(pcVar1,"vgetmantss",0xb);
      IVar2 = 0xcb;
    }
    else {
      builtin_strncpy(pcVar1,"vgetmantsd",0xb);
      IVar2 = 0xcc;
    }
    (pMyDisasm->Reserved_).MemDecoration = IVar2;
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
    if ((pMyDisasm->Reserved_).VEX.L == '\0') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    return;
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vgetmantss(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vgetmantss");
        #endif
        GV.MemDecoration = Arg3dword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vgetmantsd");
        #endif
        GV.MemDecoration = Arg3qword;
      }
      GV.EVEX.tupletype = TUPLE1_SCALAR;
      if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}